

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  IConfig *pIVar2;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  ScopedElement e;
  SectionStats *sectionStats_local;
  XmlReporter *this_local;
  
  e.m_writer = (XmlWriter *)sectionStats;
  StreamingReporterBase::sectionEnded(&this->super_StreamingReporterBase,sectionStats);
  iVar1 = this->m_sectionDepth + -1;
  this->m_sectionDepth = iVar1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"OverallResults",&local_41);
    XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffe0,(string *)&this->m_xml);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"successes",&local_79);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_78,
               (unsigned_long *)&e.m_writer[1].field_0x28);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"failures",&local_a1);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_a0,
               (unsigned_long *)&e.m_writer[1].field_0x30);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"expectedFailures",&local_c9);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_c8,
               (unsigned_long *)&e.m_writer[1].field_0x38);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    pIVar2 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"durationInSeconds",&local_f1);
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)&stack0xffffffffffffffe0,(string *)local_f0,
                 (double *)&e.m_writer[1].m_os);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    XmlWriter::endElement(&this->m_xml);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& sectionStats ) {
            StreamingReporterBase::sectionEnded( sectionStats );
            if( --m_sectionDepth > 0 ) {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes", sectionStats.assertions.passed );
                e.writeAttribute( "failures", sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

                m_xml.endElement();
            }
        }